

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderingUtils.hpp
# Opt level: O2

void __thiscall
Kernel::MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::MultiSet
          (MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *this,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *elems)

{
  bool bVar1;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *l;
  IntegerConstantType n;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> elem;
  _Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
  local_60;
  
  Lib::
  Stack<std::tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>_>
  ::Stack(&this->_elems,(long)elems->_cursor - (long)elems->_stack >> 5);
  std::
  __sort<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>*,__gnu_cxx::__ops::_Iter_less_iter>
            (elems->_stack,elems->_cursor);
  l = elems->_stack;
  do {
    if (l == elems->_cursor) {
      return;
    }
    Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Monom(&elem,l);
    IntegerConstantType::IntegerConstantType(&n,1);
    while (l = l + 1, l != elems->_cursor) {
      bVar1 = Kernel::operator==(l,&elem);
      if (!bVar1) break;
      IntegerConstantType::operator++(&n);
    }
    std::
    _Tuple_impl<0ul,Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::IntegerConstantType>
    ::
    _Tuple_impl<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>&,Kernel::IntegerConstantType&,void>
              ((_Tuple_impl<0ul,Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::IntegerConstantType>
                *)&local_60,&elem,&n);
    Lib::
    Stack<std::tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>_>
    ::push(&this->_elems,
           (tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
            *)&local_60);
    std::
    _Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
    ::~_Tuple_impl(&local_60);
    IntegerConstantType::~IntegerConstantType(&n);
    IntegerConstantType::~IntegerConstantType(&elem.numeral);
  } while( true );
}

Assistant:

MultiSet(Stack<T> elems) 
      : _elems(elems.size()) 
    {
      std::sort(elems.begin(), elems.end());
      auto iter = elems.begin();
      while (iter != elems.end()) {
        auto elem = *iter++;
        auto n = IntegerConstantType(1);
        while (iter != elems.end() && *iter == elem) {
          ++n;
          iter++;
        }
        _elems.push(std::make_tuple(elem, n));
      }
    }